

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliffordLib.cpp
# Opt level: O3

Clifford * operator^(Clifford *__return_storage_ptr__,Clifford *A,Clifford *B)

{
  pointer *ppBVar1;
  uint uVar2;
  uint uVar3;
  pointer pBVar4;
  pointer pBVar5;
  pointer pBVar6;
  iterator __position;
  int iVar7;
  Blade in_RAX;
  pointer pBVar8;
  float *pfVar9;
  ulong uVar10;
  pointer pBVar11;
  long lVar12;
  float fVar13;
  Blade local_38;
  
  (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar7 = dim;
  uVar10 = (ulong)dim;
  local_38 = in_RAX;
  if (0 < (long)uVar10) {
    memset(Re,0,uVar10 * 4);
  }
  pBVar8 = (A->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pBVar4 = (A->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (pBVar8 != pBVar4) {
    pBVar5 = (B->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    pBVar6 = (B->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
    do {
      pfVar9 = Re;
      if (pBVar5 != pBVar6) {
        uVar2 = pBVar8->mBase;
        pBVar11 = pBVar5;
        do {
          uVar3 = pBVar11->mBase;
          if (((uVar3 & uVar2) == 0) && (fVar13 = pBVar8->mVal * pBVar11->mVal, 1e-06 < ABS(fVar13))
             ) {
            pfVar9[(int)(uVar3 ^ uVar2)] =
                 (float)signs[(int)uVar2][(int)uVar3] * fVar13 + pfVar9[(int)(uVar3 ^ uVar2)];
          }
          pBVar11 = pBVar11 + 1;
        } while (pBVar11 != pBVar6);
      }
      pBVar8 = pBVar8 + 1;
    } while (pBVar8 != pBVar4);
  }
  if (0 < iVar7) {
    lVar12 = 0;
    pfVar9 = Re;
    do {
      if (1e-06 < ABS(pfVar9[lVar12])) {
        Blade::Blade(&local_38,(int)lVar12,pfVar9[lVar12]);
        __position._M_current =
             (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Blade,_std::allocator<Blade>_>::_M_realloc_insert<Blade>
                    (__return_storage_ptr__,__position,&local_38);
        }
        else {
          *__position._M_current = local_38;
          ppBVar1 = &(__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppBVar1 = *ppBVar1 + 1;
        }
        Blade::~Blade(&local_38);
        uVar10 = (ulong)(uint)dim;
        pfVar9 = Re;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < (int)uVar10);
  }
  return __return_storage_ptr__;
}

Assistant:

Clifford operator^(Clifford A, Clifford B)
{
   Clifford R; 
   //double *Re=new double[dim];
   for(int i=0;i<dim;i++)Re[i]=0;


   idx a=A.begin();
	while(a!=A.end())
	{
		int am=a->mBase;
		idx b=B.begin();
		while(b!=B.end())
		{	
			int bm=b->mBase;
			
			if((am&bm)==0)
			{
				float prd=(a->mVal)*(b->mVal);
				if(fabs(prd)>Error2)
					Re[am^bm]+=signs[am][bm]*prd;

			}
			b++;
		}
		a++;
	}

	for(int i=0;i<dim;i++)
	{if(fabs(Re[i])>Error2){R.push_back(Blade(i,Re[i]));}}
  //delete Re;
  return R;
}